

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_base.cpp
# Opt level: O0

int __thiscall zmq::hello_msg_session_t::pull_msg(hello_msg_session_t *this,msg_t *msg_)

{
  int iVar1;
  reference size_;
  int *piVar2;
  char *pcVar3;
  void *in_RDI;
  char *errstr;
  int rc;
  msg_t *in_stack_ffffffffffffffc0;
  session_base_t *in_stack_ffffffffffffffc8;
  msg_t *in_stack_ffffffffffffffd8;
  int local_4;
  
  if ((*(byte *)((long)in_RDI + 0x5f8) & 1) == 0) {
    local_4 = session_base_t::pull_msg(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  }
  else {
    *(undefined1 *)((long)in_RDI + 0x5f8) = 0;
    size_ = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       ((long)in_RDI + 0x4d0),0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)((long)in_RDI + 0x4d0));
    iVar1 = msg_t::init_buffer(in_stack_ffffffffffffffd8,in_RDI,(size_t)size_);
    if (iVar1 != 0) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      fprintf(_stderr,"%s (%s:%d)\n",pcVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/session_base.cpp"
              ,799);
      fflush(_stderr);
      zmq_abort((char *)0x236ab3);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int zmq::hello_msg_session_t::pull_msg (msg_t *msg_)
{
    if (_new_pipe) {
        _new_pipe = false;

        const int rc =
          msg_->init_buffer (&options.hello_msg[0], options.hello_msg.size ());
        errno_assert (rc == 0);

        return 0;
    }

    return session_base_t::pull_msg (msg_);
}